

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O1

void __thiscall
groundupdbext::FileKeyValueStore::setKeyValue(FileKeyValueStore *this,HashedValue *key,Set *value)

{
  HashedValue *this_00;
  Impl *pIVar1;
  long lVar2;
  pointer pbVar3;
  char cVar4;
  size_t __val;
  undefined8 *puVar5;
  long *plVar6;
  ostream *poVar7;
  size_t sVar8;
  long *plVar9;
  byte *b;
  pointer *ppbVar10;
  char cVar11;
  bool bVar12;
  byte *b_1;
  __node_base *p_Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string keyHash;
  string fp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  ofstream os;
  Bytes local_2e0;
  undefined8 uStack_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  long *local_2a0;
  uint local_298;
  long local_290 [2];
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  long *local_260 [2];
  long local_250 [2];
  HashedValue *local_240;
  FileKeyValueStore *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  __val = groundupdb::HashedValue::hash(key);
  cVar11 = '\x01';
  if (9 < __val) {
    sVar8 = __val;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (sVar8 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_001268e2;
      }
      if (sVar8 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_001268e2;
      }
      if (sVar8 < 10000) goto LAB_001268e2;
      bVar12 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar12);
    cVar11 = cVar11 + '\x01';
  }
LAB_001268e2:
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct((ulong)&local_2a0,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2a0,local_298,__val);
  pIVar1 = (this->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&(pIVar1->m_fullpath)._M_dataplus;
  local_2c0 = &local_2b0;
  local_238 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,lVar2,(pIVar1->m_fullpath)._M_string_length + lVar2);
  std::__cxx11::string::append((char *)&local_2c0);
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_2a0);
  local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  plVar6 = puVar5 + 2;
  if ((pointer *)*puVar5 == (pointer *)plVar6) {
    local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar6;
    uStack_2c8 = puVar5[3];
  }
  else {
    local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar6;
    local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*puVar5;
  }
  local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_280 = &local_270;
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_270 = *plVar9;
    lStack_268 = plVar6[3];
  }
  else {
    local_270 = *plVar9;
    local_280 = (long *)*plVar6;
  }
  local_278 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((pointer *)
      local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  local_240 = key;
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_280);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  p_Var13 = &(((value->_M_t).
               super___uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
               .
               super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
              ._M_head_impl)->_M_h)._M_before_begin;
  while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
    bVar12 = SUB81((ostream *)&local_230,0);
    poVar7 = std::ostream::_M_insert<bool>(bVar12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    poVar7 = groundupdb::operator<<((ostream *)&local_230,*(Type *)((long)(p_Var13 + 1) + 4));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    this_00 = (HashedValue *)(p_Var13 + 2);
    groundupdb::HashedValue::length(this_00);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    groundupdb::HashedValue::data(&local_2e0,this_00);
    pbVar3 = local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppbVar10 = (pointer *)
                    local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start; ppbVar10 != (pointer *)pbVar3;
        ppbVar10 = (pointer *)((long)ppbVar10 + 1)) {
      local_2c0 = (long *)CONCAT71(local_2c0._1_7_,*(undefined1 *)ppbVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)&local_2c0,1)
      ;
    }
    if ((pointer *)
        local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + bVar12);
    std::ostream::put(bVar12);
    std::ostream::flush();
    groundupdb::HashedValue::hash(this_00);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  std::ofstream::close();
  pIVar1 = (local_238->mImpl)._M_t.
           super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&(pIVar1->m_fullpath)._M_dataplus;
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_260,lVar2,(pIVar1->m_fullpath)._M_string_length + lVar2);
  std::__cxx11::string::append((char *)local_260);
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_260,(ulong)local_2a0);
  local_2c0 = &local_2b0;
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_2b0 = *plVar9;
    lStack_2a8 = plVar6[3];
  }
  else {
    local_2b0 = *plVar9;
    local_2c0 = (long *)*plVar6;
  }
  local_2b8 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c0);
  local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  plVar6 = puVar5 + 2;
  if ((pointer *)*puVar5 == (pointer *)plVar6) {
    local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar6;
    uStack_2c8 = puVar5[3];
  }
  else {
    local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar6;
    local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*puVar5;
  }
  local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_2e0);
  if ((pointer *)
      local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_260[0] != local_250) {
    operator_delete(local_260[0],local_250[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"set",3);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  groundupdb::HashedValue::data(&local_2e0,local_240);
  pbVar3 = local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppbVar10 = (pointer *)
               local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      local_2c0 = (long *)CONCAT71(local_2c0._1_7_,*(undefined1 *)ppbVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)&local_2c0,1)
      ;
      ppbVar10 = (pointer *)((long)ppbVar10 + 1);
    } while (ppbVar10 != (pointer *)pbVar3);
  }
  if ((pointer *)
      local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::ofstream::close();
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void
FileKeyValueStore::setKeyValue(const HashedValue& key,const Set& value) {
  // store in _string_set.kl file elements_num<length,value...>...
  std::ofstream os;
  std::string keyHash(std::to_string(key.hash()));
  std::string fp(mImpl->m_fullpath + "/" + keyHash + ".kv");
  os.open(fp,
          std::ios::out | std::ios::trunc);
  os << value->size() << std::endl;
  for (auto val = value->begin();val != value->end(); val++) {
    //std::cout << "  Writing set value with length: " << val->length() << ", hash: " << val->hash() << std::endl;
    os << val->hasValue() << std::endl;
    os << val->type() << std::endl;
    os << val->length() << std::endl;
    for (auto& b : val->data()) {
      os << (const char)b;
    }
    os << std::endl;
    os << val->hash() << std::endl;
  }
  os.close();
  // TODO allow multiple keys for this hash (read, modify, write)
  os.open(mImpl->m_fullpath + "/" + keyHash + ".key",
          std::ios::out | std::ios::trunc);
  os << "set" << std::endl;
  for (auto& b : key.data()) {
    os << (const char)b;
  }
  os << std::endl;
  os.close();
}